

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  CHAR_DATA *pCVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  CHAR_DATA *pCVar7;
  
  pCVar7 = room->people;
  if (pCVar7 != (CHAR_DATA *)0x0) {
    bVar3 = 0;
    do {
      bVar2 = bVar3;
      bVar4 = is_safe_new(af->owner,pCVar7,false);
      pCVar7 = pCVar7->next_in_room;
      bVar3 = bVar2 | !bVar4;
    } while (pCVar7 != (CHAR_DATA *)0x0);
    if ((bool)(bVar2 | !bVar4)) {
      do {
        for (pCVar7 = room->people; pCVar7 != (CHAR_DATA *)0x0; pCVar7 = pCVar7->next_in_room) {
          bVar4 = is_safe_new(af->owner,pCVar7,false);
          if ((!bVar4) && (iVar6 = number_percent(), 0x4f < iVar6)) {
            pCVar1 = pCVar7->fighting;
            if (af->modifier == 0) {
              af->modifier = 1;
            }
            iVar6 = dice((int)af->level,10);
            sVar5 = af->modifier;
            act("The ball of plasma hurtles about wildly, discharging pure energy into you!",pCVar7,
                (void *)0x0,(void *)0x0,3);
            act("The ball of plasma hurtles about wildly, discharging pure energy into $n!",pCVar7,
                (void *)0x0,(void *)0x0,0);
            damage_new(af->owner,pCVar7,iVar6 / (int)sVar5,(int)gsn_essence_of_plasma,0xb,true,false
                       ,0,1,"the essence of plasma*");
            if ((pCVar1 == (CHAR_DATA *)0x0) && (bVar4 = is_npc(pCVar7), !bVar4)) {
              stop_fighting(pCVar7,true);
            }
            sVar5 = (short)*(undefined4 *)&af->modifier + 1;
            af->modifier = sVar5;
            if (sVar5 < 0x19) {
              return;
            }
            affect_remove_room(room,af);
            return;
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim;
	bool valid_target = false, found = false, fighting = false;
	int dam;

	if (!room->people)
		return;

	for (victim = room->people; victim; victim = victim->next_in_room)
	{
		if (!is_safe_new(af->owner, victim, false))
			valid_target = true;
	}

	if (!valid_target)
		return;

	while (!found)
	{
		for (victim = room->people; victim; victim = victim->next_in_room)
		{
			if (is_safe_new(af->owner, victim, false))
				continue;

			if (number_percent() < 80)
				continue;

			found = true;
			break;
		}
	}

	if (victim->fighting)
		fighting = true;

	if (af->modifier == 0)
		af->modifier = 1;

	dam = dice(af->level, 10) / af->modifier;

	act("The ball of plasma hurtles about wildly, discharging pure energy into you!", victim, 0, 0, TO_CHAR);
	act("The ball of plasma hurtles about wildly, discharging pure energy into $n!", victim, 0, 0, TO_ROOM);

	damage_new(af->owner, victim, dam, gsn_essence_of_plasma, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the essence of plasma*");

	if (!fighting && !is_npc(victim))
		stop_fighting(victim, true);

	af->modifier++;

	if (af->modifier >= 25)
		affect_remove_room(room, af);
}